

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O2

int __thiscall Fl_FLTK_File_Chooser::type_fl_file(Fl_FLTK_File_Chooser *this,int val)

{
  int iVar1;
  
  iVar1 = 0;
  if (val - 1U < 5) {
    iVar1 = *(int *)(&DAT_0021447c + (ulong)(val - 1U) * 4);
  }
  return iVar1;
}

Assistant:

int Fl_FLTK_File_Chooser::type_fl_file(int val) {
  switch (val) {
    case Fl_Native_File_Chooser::BROWSE_FILE:
      return(Fl_File_Chooser::SINGLE);
    case Fl_Native_File_Chooser::BROWSE_DIRECTORY:
      return(Fl_File_Chooser::SINGLE | Fl_File_Chooser::DIRECTORY);
    case Fl_Native_File_Chooser::BROWSE_MULTI_FILE:
      return(Fl_File_Chooser::MULTI);
    case Fl_Native_File_Chooser::BROWSE_MULTI_DIRECTORY:
      return(Fl_File_Chooser::DIRECTORY | Fl_File_Chooser::MULTI);
    case Fl_Native_File_Chooser::BROWSE_SAVE_FILE:
      return(Fl_File_Chooser::SINGLE | Fl_File_Chooser::CREATE);
    case Fl_Native_File_Chooser::BROWSE_SAVE_DIRECTORY:
      return(Fl_File_Chooser::DIRECTORY | Fl_File_Chooser::MULTI | Fl_File_Chooser::CREATE);
    default:
      return(Fl_File_Chooser::SINGLE);
  }
}